

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_packsshb_mips64(uint64_t fs,uint64_t ft)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  short sVar16;
  ulong uVar17;
  undefined1 auVar15 [16];
  ulong uVar19;
  undefined1 auVar18 [16];
  
  auVar12._8_4_ = (int)fs;
  auVar12._0_8_ = fs;
  auVar12._12_4_ = (int)(fs >> 0x20);
  lVar3 = 0;
  lVar4 = 1;
  lVar1 = 4;
  auVar5 = ZEXT816(0);
  do {
    uVar17 = auVar12._8_8_ >> (lVar4 << 4);
    sVar16 = (short)uVar17;
    auVar15._0_4_ = (int)(short)(fs >> (lVar3 << 4));
    auVar15._4_4_ = (int)sVar16;
    auVar15._8_4_ = (int)sVar16;
    auVar15._12_4_ = (int)(short)(uVar17 >> 0x20);
    auVar6._0_4_ = -(uint)(auVar15._0_4_ < (int)DAT_00d83520);
    auVar6._4_4_ = -(uint)(auVar15._4_4_ < DAT_00d83520._4_4_);
    auVar6._8_4_ = -(uint)(auVar15._8_4_ < DAT_00d83520._8_4_);
    auVar6._12_4_ = -(uint)(auVar15._12_4_ < DAT_00d83520._12_4_);
    auVar6 = ~auVar6 & _DAT_00d83520 | auVar15 & auVar6;
    auVar9._0_4_ = -(uint)((int)DAT_00d83530 < auVar6._0_4_);
    auVar9._4_4_ = -(uint)(DAT_00d83530._4_4_ < auVar6._4_4_);
    auVar9._8_4_ = -(uint)(DAT_00d83530._8_4_ < auVar6._8_4_);
    auVar9 = (~auVar9 & DAT_00d83530._0_12_ | auVar6._0_12_ & auVar9) &
             SUB1612(ZEXT816(0xff000000ff),0);
    lVar8 = lVar4 << 3;
    auVar7._8_4_ = (undefined4)lVar8;
    auVar7._12_4_ = (undefined4)((ulong)lVar8 >> 0x20);
    auVar7._0_8_ = lVar8;
    auVar10._8_8_ = (ulong)auVar9._4_4_ << auVar7._8_8_;
    auVar10._0_8_ = (auVar9._0_8_ & 0xffffffff) << (lVar3 << 3);
    auVar5 = auVar5 | auVar10;
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 2;
    lVar1 = lVar1 + -2;
  } while (lVar1 != 0);
  uVar17 = auVar5._8_8_ | auVar5._0_8_;
  uVar2 = 0;
  auVar5._8_4_ = (int)ft;
  auVar5._0_8_ = ft;
  auVar5._12_4_ = (int)(ft >> 0x20);
  lVar3 = 0;
  lVar4 = 1;
  lVar1 = 4;
  do {
    uVar19 = auVar5._8_8_ >> (lVar4 << 4);
    sVar16 = (short)uVar19;
    auVar18._0_4_ = (int)(short)(ft >> (lVar3 << 4));
    auVar18._4_4_ = (int)sVar16;
    auVar18._8_4_ = (int)sVar16;
    auVar18._12_4_ = (int)(short)(uVar19 >> 0x20);
    auVar11._0_4_ = -(uint)(auVar18._0_4_ < (int)DAT_00d83520);
    auVar11._4_4_ = -(uint)(auVar18._4_4_ < DAT_00d83520._4_4_);
    auVar11._8_4_ = -(uint)(auVar18._8_4_ < DAT_00d83520._8_4_);
    auVar11._12_4_ = -(uint)(auVar18._12_4_ < DAT_00d83520._12_4_);
    auVar12 = ~auVar11 & _DAT_00d83520 | auVar18 & auVar11;
    auVar14._0_4_ = -(uint)((int)DAT_00d83530 < auVar12._0_4_);
    auVar14._4_4_ = -(uint)(DAT_00d83530._4_4_ < auVar12._4_4_);
    auVar14._8_4_ = -(uint)(DAT_00d83530._8_4_ < auVar12._8_4_);
    auVar9 = (~auVar14 & DAT_00d83530._0_12_ | auVar12._0_12_ & auVar14) &
             SUB1612(ZEXT816(0xff000000ff),0);
    lVar8 = lVar4 * 8 + 0x20;
    auVar13._8_4_ = (undefined4)lVar8;
    auVar13._12_4_ = (undefined4)((ulong)lVar8 >> 0x20);
    auVar13._0_8_ = lVar8;
    uVar17 = uVar17 | (auVar9._0_8_ & 0xffffffff) << lVar3 * 8 + 0x20;
    uVar2 = uVar2 | (ulong)auVar9._4_4_ << auVar13._8_8_;
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 2;
    lVar1 = lVar1 + -2;
  } while (lVar1 != 0);
  return uVar2 | uVar17;
}

Assistant:

uint64_t helper_packsshb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}